

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O0

REF_STATUS ref_validation_cell_volume_at_node(REF_GRID ref_grid,REF_INT node)

{
  uint uVar1;
  uint local_d4;
  uint local_d0;
  int local_cc;
  int local_c8;
  REF_INT cell_node;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT nodes [27];
  uint local_40;
  int local_3c;
  REF_INT cell;
  REF_INT item;
  REF_DBL volume;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_GRID pRStack_18;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  volume = (REF_DBL)ref_grid->cell[8];
  if (ref_grid->twod != 0) {
    volume = (REF_DBL)ref_grid->cell[3];
  }
  if ((node < 0) || (**(int **)((long)volume + 0x40) <= node)) {
    local_cc = -1;
  }
  else {
    local_cc = *(int *)(*(long *)(*(long *)((long)volume + 0x40) + 8) + (long)node * 4);
  }
  local_3c = local_cc;
  if (local_cc == -1) {
    local_d0 = 0xffffffff;
  }
  else {
    local_d0 = *(uint *)(*(long *)(*(long *)((long)volume + 0x40) + 0x10) + 4 + (long)local_cc * 8);
  }
  local_40 = local_d0;
  ref_node._4_4_ = node;
  pRStack_18 = ref_grid;
  while( true ) {
    if (local_3c == -1) {
      return 0;
    }
    uVar1 = ref_cell_nodes((REF_CELL)volume,local_40,&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
             0x1bd,"ref_validation_cell_volume_at_node",(ulong)uVar1,"nodes");
      return uVar1;
    }
    if (pRStack_18->twod == 0) {
      uVar1 = ref_node_tet_vol((REF_NODE)ref_cell,&ref_private_macro_code_rss_1,(REF_DBL *)&cell);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
               ,0x1c1,"ref_validation_cell_volume_at_node",(ulong)uVar1,"vol");
        return uVar1;
      }
    }
    else {
      uVar1 = ref_node_tri_area((REF_NODE)ref_cell,&ref_private_macro_code_rss_1,(REF_DBL *)&cell);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
               ,0x1bf,"ref_validation_cell_volume_at_node",(ulong)uVar1,"area");
        return uVar1;
      }
    }
    if (_cell <= 0.0) break;
    local_3c = *(int *)(*(long *)(*(long *)((long)volume + 0x40) + 0x10) + (long)local_3c * 8);
    if (local_3c == -1) {
      local_d4 = 0xffffffff;
    }
    else {
      local_d4 = *(uint *)(*(long *)(*(long *)((long)volume + 0x40) + 0x10) + 4 + (long)local_3c * 8
                          );
    }
    local_40 = local_d4;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
         0x1c8,"ref_validation_cell_volume_at_node","negative volume tet");
  printf("cell %d volume %e\n",_cell,(ulong)local_40);
  for (local_c8 = 0; local_c8 < *(int *)((long)volume + 0xc); local_c8 = local_c8 + 1) {
    ref_node_location((REF_NODE)ref_cell,(&ref_private_macro_code_rss_1)[local_c8]);
  }
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_validation_cell_volume_at_node(REF_GRID ref_grid,
                                                      REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_DBL volume;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];

  ref_cell = ref_grid_tet(ref_grid);
  if (ref_grid_twod(ref_grid)) ref_cell = ref_grid_tri(ref_grid);

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    if (ref_grid_twod(ref_grid)) {
      RSS(ref_node_tri_area(ref_node, nodes, &volume), "area");
    } else {
      RSS(ref_node_tet_vol(ref_node, nodes, &volume), "vol");
    }
    RAB(volume > 0.0, "negative volume tet", {
      REF_INT cell_node;
      printf("cell %d volume %e\n", cell, volume);
      each_ref_cell_cell_node(ref_cell, cell_node)
          ref_node_location(ref_node, nodes[cell_node]);
    });
  }

  return REF_SUCCESS;
}